

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::RepeatedField<bool>::erase
          (RepeatedField<bool> *this,const_iterator first,const_iterator last)

{
  void *pvVar1;
  int iVar2;
  size_t __n;
  void *__dest;
  
  pvVar1 = this->arena_or_elements_;
  iVar2 = (int)first - (int)pvVar1;
  if (first != last) {
    __dest = (void *)((long)iVar2 + (long)pvVar1);
    __n = (long)pvVar1 + ((long)this->current_size_ - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
    }
    if (0 < this->current_size_) {
      this->current_size_ = ((int)__dest + (int)__n) - *(int *)&this->arena_or_elements_;
    }
  }
  return (iterator)((long)iVar2 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}